

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3NestedParse(Parse *pParse,char *zFormat,...)

{
  Token *__src;
  u32 uVar1;
  sqlite3 *db;
  char in_AL;
  char *zSql;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char saveBuf [136];
  undefined1 auStack_198 [16];
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined1 local_e8 [144];
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  if (in_AL != '\0') {
    local_168 = in_XMM0_Da;
    local_158 = in_XMM1_Qa;
    local_148 = in_XMM2_Qa;
    local_138 = in_XMM3_Qa;
    local_128 = in_XMM4_Qa;
    local_118 = in_XMM5_Qa;
    local_108 = in_XMM6_Qa;
    local_f8 = in_XMM7_Qa;
  }
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  db = pParse->db;
  uVar1 = db->mDbFlags;
  local_188 = in_RDX;
  local_180 = in_RCX;
  local_178 = in_R8;
  local_170 = in_R9;
  memset(local_e8,0xaa,0x88);
  if ((pParse->nErr == 0) && (pParse->eParseMode == '\0')) {
    puStack_50 = &stack0x00000008;
    local_58 = (undefined1 *)0x3000000010;
    local_48 = auStack_198;
    zSql = sqlite3VMPrintf(db,zFormat,(__va_list_tag *)&local_58);
    if (zSql == (char *)0x0) {
      if (db->mallocFailed == '\0') {
        pParse->rc = 0x12;
      }
      pParse->nErr = pParse->nErr + 1;
    }
    else {
      pParse->nested = pParse->nested + '\x01';
      __src = &pParse->sLastToken;
      memcpy(local_e8,__src,0x88);
      memset(__src,0,0x88);
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 2;
      sqlite3RunParser(pParse,zSql);
      db->mDbFlags = uVar1;
      sqlite3DbFreeNN(db,zSql);
      memcpy(__src,local_e8,0x88);
      pParse->nested = pParse->nested + 0xff;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3NestedParse(Parse *pParse, const char *zFormat, ...){
  va_list ap;
  char *zSql;
  sqlite3 *db = pParse->db;
  u32 savedDbFlags = db->mDbFlags;
  char saveBuf[PARSE_TAIL_SZ];

  if( pParse->nErr ) return;
  if( pParse->eParseMode ) return;
  assert( pParse->nested<10 );  /* Nesting should only be of limited depth */
  va_start(ap, zFormat);
  zSql = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  if( zSql==0 ){
    /* This can result either from an OOM or because the formatted string
    ** exceeds SQLITE_LIMIT_LENGTH.  In the latter case, we need to set
    ** an error */
    if( !db->mallocFailed ) pParse->rc = SQLITE_TOOBIG;
    pParse->nErr++;
    return;
  }
  pParse->nested++;
  memcpy(saveBuf, PARSE_TAIL(pParse), PARSE_TAIL_SZ);
  memset(PARSE_TAIL(pParse), 0, PARSE_TAIL_SZ);
  db->mDbFlags |= DBFLAG_PreferBuiltin;
  sqlite3RunParser(pParse, zSql);
  db->mDbFlags = savedDbFlags;
  sqlite3DbFree(db, zSql);
  memcpy(PARSE_TAIL(pParse), saveBuf, PARSE_TAIL_SZ);
  pParse->nested--;
}